

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O3

int __thiscall ON_MorphControl::Order(ON_MorphControl *this,int dir)

{
  int iVar1;
  
  iVar1 = this->m_varient;
  if (iVar1 == 3) {
    if ((uint)dir < 3) {
      return (this->m_nurbs_cage).m_order[(uint)dir];
    }
  }
  else {
    if (iVar1 == 2) {
      iVar1 = ON_NurbsSurface::Order(&this->m_nurbs_surface,dir);
      return iVar1;
    }
    if ((iVar1 == 1) && (dir == 0)) {
      iVar1 = ON_NurbsCurve::Order(&this->m_nurbs_curve);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int ON_MorphControl::Order(int dir) const
{
  int rc = 0;
  switch(m_varient)
  {
  case 1:
    rc = (0==dir) ? m_nurbs_curve.Order() : 0;
    break;
  case 2:
    rc = m_nurbs_surface.Order(dir);
    break;
  case 3:
    rc = m_nurbs_cage.Order(dir);
    break;
  }
  return rc;
}